

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

void __thiscall BackwardPass::BackwardPass(BackwardPass *this,Func *func,GlobOpt *globOpt,Phase tag)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Phase tag_local;
  GlobOpt *globOpt_local;
  Func *func_local;
  BackwardPass *this_local;
  
  this->func = func;
  this->globOpt = globOpt;
  this->tempAlloc = (JitArenaAllocator *)0x0;
  this->tag = tag;
  this->currentPrePassLoop = (Loop *)0x0;
  this->currentRegion = (Region *)0x0;
  this->preOpBailOutInstrToProcess = (Instr *)0x0;
  this->isCollectionPass = false;
  this->collectionPassSubPhase = None;
  this->isLoopPrepass = false;
  this->floatSymEquivalenceMap = (FloatSymEquivalenceMap *)0x0;
  if (((tag != BackwardPhase) && (tag != DeadStorePhase)) && (tag != CaptureByteCodeRegUsePhase)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x12,
                       "(tag == Js::BackwardPhase || tag == Js::DeadStorePhase || tag == Js::CaptureByteCodeRegUsePhase)"
                       ,
                       "tag == Js::BackwardPhase || tag == Js::DeadStorePhase || tag == Js::CaptureByteCodeRegUsePhase"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this->isCollectionPass = tag == CaptureByteCodeRegUsePhase;
  this->implicitCallBailouts = 0;
  this->fieldOpts = 0;
  this->numDeadStore = 0;
  this->numMarkTempNumber = 0;
  this->numMarkTempNumberTransferred = 0;
  this->numMarkTempObject = 0;
  return;
}

Assistant:

BackwardPass::BackwardPass(Func * func, GlobOpt * globOpt, Js::Phase tag)
    : func(func), globOpt(globOpt), tag(tag), currentPrePassLoop(nullptr), tempAlloc(nullptr),
    preOpBailOutInstrToProcess(nullptr),
    isCollectionPass(false), currentRegion(nullptr),
    collectionPassSubPhase(CollectionPassSubPhase::None),
    isLoopPrepass(false)
{
    // Those are the only three phases BackwardPass will use currently
    Assert(tag == Js::BackwardPhase || tag == Js::DeadStorePhase || tag == Js::CaptureByteCodeRegUsePhase);

#if DBG
    // The CaptureByteCodeRegUse phase is just a collection phase, no mutations should occur
    this->isCollectionPass = tag == Js::CaptureByteCodeRegUsePhase;
#endif
    this->implicitCallBailouts = 0;
    this->fieldOpts = 0;

#if DBG_DUMP
    this->numDeadStore = 0;
    this->numMarkTempNumber = 0;
    this->numMarkTempNumberTransferred = 0;
    this->numMarkTempObject = 0;
#endif
}